

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.h
# Opt level: O0

Result<wasm::HeapType> *
wasm::WATParser::typeuse<wasm::WATParser::ParseDefsCtx>
          (Result<wasm::HeapType> *__return_storage_ptr__,ParseDefsCtx *ctx,bool allowNames)

{
  __index_type *__return_storage_ptr___00;
  __index_type *__return_storage_ptr___01;
  optional<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT> type_00;
  undefined4 pos_00;
  bool bVar1;
  HeapTypeT *__u;
  Err *pEVar2;
  vector<wasm::NameType,_std::allocator<wasm::NameType>_> *params;
  vector<wasm::Type,_std::allocator<wasm::Type>_> *results;
  basic_string_view<char,_std::char_traits<char>_> expected;
  Err local_218;
  Err *local_1f8;
  Err *err_2;
  MaybeResult<std::vector<wasm::Type,_std::allocator<wasm::Type>_>_> _val_2;
  MaybeResult<std::vector<wasm::Type,_std::allocator<wasm::Type>_>_> resultTypes;
  Err *err_1;
  MaybeResult<std::vector<wasm::NameType,_std::allocator<wasm::NameType>_>_> _val_1;
  MaybeResult<std::vector<wasm::NameType,_std::allocator<wasm::NameType>_>_> namedParams;
  string local_120;
  Err local_100;
  uint local_dc;
  Err local_d8;
  Err *local_b8;
  Err *err;
  undefined1 local_a0 [8];
  Result<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT> _val;
  Result<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT> x;
  undefined1 auStack_40 [8];
  optional<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT> type;
  size_t pos;
  bool allowNames_local;
  ParseDefsCtx *ctx_local;
  
  type.
  super__Optional_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_true,_true>
  ._M_payload.
  super__Optional_payload_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT>
  ._16_8_ = Lexer::getPos(&ctx->in);
  std::optional<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT>::optional
            ((optional<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT> *)
             auStack_40);
  expected = sv("type",4);
  bVar1 = Lexer::takeSExprStart(&ctx->in,expected);
  if (bVar1) {
    __return_storage_ptr___00 =
         (__index_type *)
         ((long)&_val.val.
                 super__Variant_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                 .
                 super__Move_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                 .
                 super__Copy_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                 .
                 super__Move_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                 .
                 super__Copy_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
         + 0x20);
    typeidx<wasm::WATParser::ParseDefsCtx>
              ((Result<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT> *)
               __return_storage_ptr___00,ctx);
    Result<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT>::Result
              ((Result<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT> *)
               local_a0,(Result<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT>
                         *)__return_storage_ptr___00);
    local_b8 = Result<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT>::
               getErr((Result<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT>
                       *)local_a0);
    bVar1 = local_b8 != (Err *)0x0;
    if (bVar1) {
      wasm::Err::Err(&local_d8,local_b8);
      Result<wasm::HeapType>::Result(__return_storage_ptr__,&local_d8);
      wasm::Err::~Err(&local_d8);
    }
    local_dc = (uint)bVar1;
    Result<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT>::~Result
              ((Result<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT> *)
               local_a0);
    if (local_dc == 0) {
      bVar1 = Lexer::takeRParen(&ctx->in);
      if (bVar1) {
        __u = Result<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT>::
              operator*((Result<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT>
                         *)((long)&_val.val.
                                   super__Variant_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                                   .
                                   super__Move_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                                   .
                                   super__Copy_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                                   .
                                   super__Move_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                                   .
                                   super__Copy_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                           + 0x20));
        std::optional<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT>::
        operator=((optional<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT>
                   *)auStack_40,__u);
        local_dc = 0;
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_120,"expected end of type use",
                   (allocator<char> *)
                   ((long)&namedParams.val.
                           super__Variant_base<std::vector<wasm::NameType,_std::allocator<wasm::NameType>_>,_wasm::None,_wasm::Err>
                           .
                           super__Move_assign_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>
                           .
                           super__Copy_assign_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>
                           .
                           super__Move_ctor_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>
                           .
                           super__Copy_ctor_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>
                   + 0x27));
        Lexer::err(&local_100,&ctx->in,&local_120);
        Result<wasm::HeapType>::Result(__return_storage_ptr__,&local_100);
        wasm::Err::~Err(&local_100);
        std::__cxx11::string::~string((string *)&local_120);
        std::allocator<char>::~allocator
                  ((allocator<char> *)
                   ((long)&namedParams.val.
                           super__Variant_base<std::vector<wasm::NameType,_std::allocator<wasm::NameType>_>,_wasm::None,_wasm::Err>
                           .
                           super__Move_assign_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>
                           .
                           super__Copy_assign_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>
                           .
                           super__Move_ctor_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>
                           .
                           super__Copy_ctor_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>
                   + 0x27));
        local_dc = 1;
      }
    }
    Result<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT>::~Result
              ((Result<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT> *)
               ((long)&_val.val.
                       super__Variant_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                       .
                       super__Move_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                       .
                       super__Copy_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                       .
                       super__Move_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                       .
                       super__Copy_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
               + 0x20));
    if (local_dc != 0) {
      return __return_storage_ptr__;
    }
  }
  __return_storage_ptr___01 =
       (__index_type *)
       ((long)&_val_1.val.
               super__Variant_base<std::vector<wasm::NameType,_std::allocator<wasm::NameType>_>,_wasm::None,_wasm::Err>
               .super__Move_assign_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>.
               super__Copy_assign_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>.
               super__Move_ctor_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>.
               super__Copy_ctor_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err> + 0x20);
  params<wasm::WATParser::ParseDefsCtx>
            ((MaybeResult<std::vector<wasm::NameType,_std::allocator<wasm::NameType>_>_> *)
             __return_storage_ptr___01,ctx,allowNames);
  MaybeResult<std::vector<wasm::NameType,_std::allocator<wasm::NameType>_>_>::MaybeResult
            ((MaybeResult<std::vector<wasm::NameType,_std::allocator<wasm::NameType>_>_> *)&err_1,
             (MaybeResult<std::vector<wasm::NameType,_std::allocator<wasm::NameType>_>_> *)
             __return_storage_ptr___01);
  pEVar2 = MaybeResult<std::vector<wasm::NameType,_std::allocator<wasm::NameType>_>_>::getErr
                     ((MaybeResult<std::vector<wasm::NameType,_std::allocator<wasm::NameType>_>_> *)
                      &err_1);
  if (pEVar2 != (Err *)0x0) {
    wasm::Err::Err((Err *)((long)&resultTypes.val.
                                  super__Variant_base<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_wasm::None,_wasm::Err>
                                  .
                                  super__Move_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>
                                  .
                                  super__Copy_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>
                                  .
                                  super__Move_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>
                                  .
                                  super__Copy_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>
                          + 0x20),pEVar2);
    Result<wasm::HeapType>::Result
              (__return_storage_ptr__,
               (Err *)((long)&resultTypes.val.
                              super__Variant_base<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_wasm::None,_wasm::Err>
                              .
                              super__Move_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>
                              .
                              super__Copy_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>
                              .
                              super__Move_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>
                              .
                              super__Copy_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>
                      + 0x20));
    wasm::Err::~Err((Err *)((long)&resultTypes.val.
                                   super__Variant_base<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_wasm::None,_wasm::Err>
                                   .
                                   super__Move_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>
                                   .
                                   super__Copy_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>
                                   .
                                   super__Move_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>
                                   .
                                   super__Copy_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>
                           + 0x20));
  }
  local_dc = (uint)(pEVar2 != (Err *)0x0);
  MaybeResult<std::vector<wasm::NameType,_std::allocator<wasm::NameType>_>_>::~MaybeResult
            ((MaybeResult<std::vector<wasm::NameType,_std::allocator<wasm::NameType>_>_> *)&err_1);
  if (local_dc == 0) {
    results<wasm::WATParser::ParseDefsCtx>
              ((MaybeResult<std::vector<wasm::Type,_std::allocator<wasm::Type>_>_> *)
               ((long)&_val_2.val.
                       super__Variant_base<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_wasm::None,_wasm::Err>
                       .super__Move_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
                       super__Copy_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
                       super__Move_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
                       super__Copy_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err> + 0x20
               ),ctx);
    MaybeResult<std::vector<wasm::Type,_std::allocator<wasm::Type>_>_>::MaybeResult
              ((MaybeResult<std::vector<wasm::Type,_std::allocator<wasm::Type>_>_> *)&err_2,
               (MaybeResult<std::vector<wasm::Type,_std::allocator<wasm::Type>_>_> *)
               ((long)&_val_2.val.
                       super__Variant_base<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_wasm::None,_wasm::Err>
                       .super__Move_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
                       super__Copy_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
                       super__Move_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
                       super__Copy_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err> + 0x20
               ));
    local_1f8 = MaybeResult<std::vector<wasm::Type,_std::allocator<wasm::Type>_>_>::getErr
                          ((MaybeResult<std::vector<wasm::Type,_std::allocator<wasm::Type>_>_> *)
                           &err_2);
    bVar1 = local_1f8 != (Err *)0x0;
    if (bVar1) {
      wasm::Err::Err(&local_218,local_1f8);
      Result<wasm::HeapType>::Result(__return_storage_ptr__,&local_218);
      wasm::Err::~Err(&local_218);
    }
    local_dc = (uint)bVar1;
    MaybeResult<std::vector<wasm::Type,_std::allocator<wasm::Type>_>_>::~MaybeResult
              ((MaybeResult<std::vector<wasm::Type,_std::allocator<wasm::Type>_>_> *)&err_2);
    if (local_dc == 0) {
      pos_00 = type.
               super__Optional_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_true,_true>
               ._M_payload.
               super__Optional_payload_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT>
               ._16_4_;
      params = MaybeResult<std::vector<wasm::NameType,_std::allocator<wasm::NameType>_>_>::getPtr
                         ((MaybeResult<std::vector<wasm::NameType,_std::allocator<wasm::NameType>_>_>
                           *)((long)&_val_1.val.
                                     super__Variant_base<std::vector<wasm::NameType,_std::allocator<wasm::NameType>_>,_wasm::None,_wasm::Err>
                                     .
                                     super__Move_assign_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>
                                     .
                                     super__Copy_assign_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>
                                     .
                                     super__Move_ctor_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>
                                     .
                                     super__Copy_ctor_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>
                             + 0x20));
      results = MaybeResult<std::vector<wasm::Type,_std::allocator<wasm::Type>_>_>::getPtr
                          ((MaybeResult<std::vector<wasm::Type,_std::allocator<wasm::Type>_>_> *)
                           ((long)&_val_2.val.
                                   super__Variant_base<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_wasm::None,_wasm::Err>
                                   .
                                   super__Move_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>
                                   .
                                   super__Copy_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>
                                   .
                                   super__Move_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>
                                   .
                                   super__Copy_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>
                           + 0x20));
      type_00.
      super__Optional_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_true,_true>
      ._M_payload.
      super__Optional_payload_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT>
      ._M_payload._8_8_ =
           type.
           super__Optional_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_true,_true>
           ._M_payload.
           super__Optional_payload_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT>
           ._M_payload._M_value.type.id;
      type_00.
      super__Optional_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_true,_true>
      ._M_payload.
      super__Optional_payload_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT>
      ._M_payload._M_value.type.id = (HeapType)(HeapType)auStack_40;
      type_00.
      super__Optional_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_true,_true>
      ._M_payload.
      super__Optional_payload_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT>
      ._16_8_ = type.
                super__Optional_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_true,_true>
                ._M_payload.
                super__Optional_payload_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT>
                ._M_payload._8_8_;
      ParseDefsCtx::makeTypeUse(__return_storage_ptr__,ctx,pos_00,type_00,params,results);
      local_dc = 1;
    }
    MaybeResult<std::vector<wasm::Type,_std::allocator<wasm::Type>_>_>::~MaybeResult
              ((MaybeResult<std::vector<wasm::Type,_std::allocator<wasm::Type>_>_> *)
               ((long)&_val_2.val.
                       super__Variant_base<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_wasm::None,_wasm::Err>
                       .super__Move_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
                       super__Copy_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
                       super__Move_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
                       super__Copy_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err> + 0x20
               ));
  }
  MaybeResult<std::vector<wasm::NameType,_std::allocator<wasm::NameType>_>_>::~MaybeResult
            ((MaybeResult<std::vector<wasm::NameType,_std::allocator<wasm::NameType>_>_> *)
             ((long)&_val_1.val.
                     super__Variant_base<std::vector<wasm::NameType,_std::allocator<wasm::NameType>_>,_wasm::None,_wasm::Err>
                     .super__Move_assign_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>.
                     super__Copy_assign_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>.
                     super__Move_ctor_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>.
                     super__Copy_ctor_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err> +
             0x20));
  return __return_storage_ptr__;
}

Assistant:

Result<typename Ctx::TypeUseT> typeuse(Ctx& ctx, bool allowNames) {
  auto pos = ctx.in.getPos();
  std::optional<typename Ctx::HeapTypeT> type;
  if (ctx.in.takeSExprStart("type"sv)) {
    auto x = typeidx(ctx);
    CHECK_ERR(x);

    if (!ctx.in.takeRParen()) {
      return ctx.in.err("expected end of type use");
    }

    type = *x;
  }

  auto namedParams = params(ctx, allowNames);
  CHECK_ERR(namedParams);

  auto resultTypes = results(ctx);
  CHECK_ERR(resultTypes);

  return ctx.makeTypeUse(pos, type, namedParams.getPtr(), resultTypes.getPtr());
}